

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

ScriptFunction *
Js::GlobalObject::DefaultEvalHelper
          (ScriptContext *scriptContext,char16 *source,int sourceLength,ModuleID moduleID,
          uint32 grfscr,LPCOLESTR pszTitle,BOOL registerDocument,BOOL isIndirect,BOOL strictMode)

{
  SourceContextInfo *this;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  ULONG UVar4;
  uint parseFlags;
  HRESULT hrParser_00;
  BOOL BVar5;
  undefined4 *puVar6;
  ThreadContext *pTVar7;
  undefined8 uVar8;
  PageAllocator *pageAllocator;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  size_t numBytes;
  SRCINFO *srcInfo;
  SourceContextInfo **ppSVar9;
  FunctionBody *this_01;
  Utf8SourceInfo *callerUtf8SourceInfo;
  Utf8SourceInfo *this_02;
  JavascriptLibrary *pJVar10;
  ScriptContext *local_e18;
  ULONG local_d94;
  ScriptFunction *pfuncScript;
  Utf8SourceInfo *utf8SourceInfo;
  Utf8SourceInfo *parentUtf8SourceInfo;
  FunctionBody *parentFuncBody;
  JavascriptFunction *pfuncCaller;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  AutoDynamicCodeReference dynamicFunctionReference;
  ULONG deferParseThreshold;
  SourceContextInfo *sourceContextInfo;
  ParseNodeProg *parseTree;
  undefined1 local_ca8 [7];
  bool forceNoNative;
  Parser parser;
  Utf8SourceInfo *sourceInfo;
  SRCINFO *pSrcInfo;
  size_t cbSource;
  TrackAllocData local_1d8;
  uchar *local_1b0;
  LPUTF8 utf8Source;
  ArenaAllocator tempArena;
  size_t cbUtf8Buffer;
  uint cchSource;
  AutoHandledExceptionType __autoHandledExceptionType;
  AutoReentrancyHandler autoReentrancyHandler;
  undefined1 local_f8 [8];
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  void *__frameAddr;
  ParseableFunctionInfo *pPStack_c0;
  uint sourceIndex;
  ParseableFunctionInfo *funcBody;
  CompileScriptException se;
  HRESULT hrCodeGen;
  HRESULT hrParser;
  HRESULT hr;
  void *frameAddr;
  LPCOLESTR pszTitle_local;
  uint32 grfscr_local;
  ModuleID moduleID_local;
  int sourceLength_local;
  char16 *source_local;
  ScriptContext *scriptContext_local;
  
  if (sourceLength < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x333,"(sourceLength >= 0)","sourceLength >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x334,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pTVar7 = ScriptContext::GetThreadContext(scriptContext);
  bVar2 = ThreadContext::EvalDisabled(pTVar7);
  if (bVar2) {
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&EvalDisabledException::typeinfo,0);
  }
  ScriptContext::ProfileBegin(scriptContext,EvalCompilePhase);
  se.bstrLine._4_4_ = 0;
  CompileScriptException::CompileScriptException((CompileScriptException *)&funcBody);
  pPStack_c0 = (ParseableFunctionInfo *)0x0;
  __frameAddr._4_4_ = 0xffffffff;
  __leaveScriptObject._32_8_ = &stack0xfffffffffffffff8;
  LeaveScriptObject<true,_false,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_false,_false> *)local_f8,scriptContext,
             &stack0xfffffffffffffff8);
  pTVar7 = ScriptContext::GetThreadContext(scriptContext);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)&cchSource,pTVar7);
  AutoHandledExceptionType::AutoHandledExceptionType
            ((AutoHandledExceptionType *)((long)&cbUtf8Buffer + 7),
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  cbUtf8Buffer._0_4_ = sourceLength;
  uVar3 = UInt32Math::MulAdd<3u,1u>(sourceLength);
  tempArena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       (void *)(ulong)uVar3;
  pTVar7 = ScriptContext::GetThreadContext(scriptContext);
  pageAllocator = ThreadContext::GetPageAllocator(pTVar7);
  Memory::ArenaAllocator::ArenaAllocator
            ((ArenaAllocator *)&utf8Source,L"EvalHelperArena",pageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1d8,(type_info *)&unsigned_char::typeinfo,0,
             (size_t)tempArena.
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     freeList,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
             ,0x34d);
  this_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           &utf8Source,&local_1d8);
  local_1b0 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                        ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                         (size_t)tempArena.
                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 .freeList);
  if (0x7ffffffe < (uint)cbUtf8Buffer) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x34f,"(cchSource < 0x7fffffff)","cchSource < MAXLONG");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  numBytes = utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                       (local_1b0,
                        (size_t)tempArena.
                                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                .freeList,source,(uint)cbUtf8Buffer);
  if (tempArena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList <
      (void *)(numBytes + 1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x351,"(cbSource + 1 <= cbUtf8Buffer)",
                                "cbSource + 1 <= cbUtf8Buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  srcInfo = ScriptContext::GetModuleSrcInfo(scriptContext,moduleID);
  EnterPinnedScope((void **)&parser.m_deferringAST);
  parser._2720_8_ =
       Utf8SourceInfo::New(scriptContext,local_1b0,(uint)cbUtf8Buffer,numBytes,srcInfo,
                           (bool)((byte)(grfscr >> 0x11) & 1));
  Parser::Parser((Parser *)local_ca8,scriptContext,strictMode,(PageAllocator *)0x0,false,0xaa8);
  parseTree._7_1_ = 0;
  sourceContextInfo = (SourceContextInfo *)0x0;
  ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__
                      ((WriteBarrierPtr *)srcInfo);
  this = *ppSVar9;
  bVar2 = SourceContextInfo::IsSourceProfileLoaded(this);
  UVar4 = Parser::GetDeferralThreshold(bVar2);
  pszTitle_local._4_4_ = grfscr;
  if ((UVar4 < (uint)sourceLength) &&
     (bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,DeferParsePhase), !bVar2)) {
    pszTitle_local._4_4_ = grfscr | 8;
  }
  parseFlags = pszTitle_local._4_4_ | 0x20;
  local_d94 = parseFlags;
  if (isIndirect != 0) {
    local_d94 = pszTitle_local._4_4_ & 0xfffffbff | 0x20;
  }
  hrParser_00 = Parser::ParseCesu8Source
                          ((Parser *)local_ca8,(ParseNodeProg **)&sourceContextInfo,local_1b0,
                           numBytes,local_d94,(CompileScriptException *)&funcBody,
                           &this->nextLocalFunctionId,this);
  Utf8SourceInfo::SetParseFlags((Utf8SourceInfo *)parser._2720_8_,parseFlags);
  if ((-1 < hrParser_00) && (sourceContextInfo != (SourceContextInfo *)0x0)) {
    AutoDynamicCodeReference::AutoDynamicCodeReference
              ((AutoDynamicCodeReference *)&stack0xfffffffffffff330,scriptContext);
    if (0x7ffffffe < (uint)cbUtf8Buffer) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x374,"(cchSource < 0x7fffffff)","cchSource < MAXLONG");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    __frameAddr._4_4_ =
         ScriptContext::SaveSourceNoCopy
                   (scriptContext,(Utf8SourceInfo *)parser._2720_8_,(uint)cbUtf8Buffer,true);
    if (((isIndirect != 0) && (strictMode == 0)) &&
       (bVar2 = ParseNodeFnc::GetStrictMode((ParseNodeFnc *)sourceContextInfo), !bVar2)) {
      parseFlags = pszTitle_local._4_4_ & 0xfffffbff | 0x20;
    }
    pszTitle_local._4_4_ = parseFlags;
    se.bstrLine._4_4_ =
         GenerateByteCode((ParseNodeProg *)sourceContextInfo,pszTitle_local._4_4_,scriptContext,
                          &stack0xffffffffffffff40,__frameAddr._4_4_,(bool)(parseTree._7_1_ & 1),
                          (Parser *)local_ca8,(CompileScriptException *)&funcBody,(ScopeInfo *)0x0,
                          (ScriptFunction **)0x0);
    Utf8SourceInfo::SetByteCodeGenerationFlags
              ((Utf8SourceInfo *)parser._2720_8_,pszTitle_local._4_4_);
    AutoDynamicCodeReference::~AutoDynamicCodeReference
              ((AutoDynamicCodeReference *)&stack0xfffffffffffff330);
    parseFlags = pszTitle_local._4_4_;
  }
  pszTitle_local._4_4_ = parseFlags;
  LeavePinnedScope();
  Parser::~Parser((Parser *)local_ca8);
  Memory::ArenaAllocator::~ArenaAllocator((ArenaAllocator *)&utf8Source);
  AutoHandledExceptionType::~AutoHandledExceptionType
            ((AutoHandledExceptionType *)((long)&cbUtf8Buffer + 7));
  if (scriptContext != (ScriptContext *)0x0) {
    pTVar7 = ScriptContext::GetThreadContext(scriptContext);
    ThreadContext::DisposeOnLeaveScript(pTVar7);
  }
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)&cchSource);
  LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_false,_false> *)local_f8);
  ScriptContext::ProfileEnd(scriptContext,EvalCompilePhase);
  if (hrParser_00 < 0) {
    JavascriptError::ThrowParserError(scriptContext,hrParser_00,(CompileScriptException *)&funcBody)
    ;
  }
  if (se.bstrLine._4_4_ < 0) {
    if (se.bstrLine._4_4_ != -0x7999bffc) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x394,"(hrCodeGen == ((HRESULT)0x86664004L))",
                                  "hrCodeGen == SCRIPT_E_RECORDED");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    se.bstrLine._4_4_ = (int)se.super_ScriptException.ei.pfnDeferredFillIn;
    CompileScriptException::Free((CompileScriptException *)&funcBody);
    if (se.bstrLine._4_4_ == -0x7ff5ffe4) {
      JavascriptError::ThrowStackOverflowError(scriptContext,(PVOID)0x0);
    }
    if (se.bstrLine._4_4_ != -0x7ff5ebe4) {
      JavascriptError::MapAndThrowError(scriptContext,se.bstrLine._4_4_);
    }
    if (__frameAddr._4_4_ != 0xffffffff) {
      ScriptContext::RemoveSource(scriptContext,__frameAddr._4_4_);
    }
    scriptContext_local =
         (ScriptContext *)
         DefaultEvalHelper(scriptContext,source,sourceLength,moduleID,pszTitle_local._4_4_ | 0x4000,
                           pszTitle,registerDocument,isIndirect,strictMode);
  }
  else {
    if (pPStack_c0 == (ParseableFunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x3af,"(funcBody != nullptr)","funcBody != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    ParseableFunctionInfo::SetDisplayName(pPStack_c0,pszTitle);
    FunctionProxy::SetIsTopLevel(&pPStack_c0->super_FunctionProxy,true);
    if ((pszTitle_local._4_4_ & 0x20000) == 0) {
      parentFuncBody = (FunctionBody *)0x0;
      BVar5 = JavascriptStackWalker::GetCaller((JavascriptFunction **)&parentFuncBody,scriptContext)
      ;
      if (((BVar5 != 0) && (parentFuncBody != (FunctionBody *)0x0)) &&
         (BVar5 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)parentFuncBody),
         BVar5 != 0)) {
        this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)parentFuncBody);
        callerUtf8SourceInfo = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this_01);
        this_02 = FunctionProxy::GetUtf8SourceInfo(&pPStack_c0->super_FunctionProxy);
        Utf8SourceInfo::SetCallerUtf8SourceInfo(this_02,callerUtf8SourceInfo);
      }
    }
    if (registerDocument != 0) {
      ParseableFunctionInfo::RegisterFuncToDiag(pPStack_c0,scriptContext,pszTitle);
      pPStack_c0 = FunctionProxy::GetParseableFunctionInfo(&pPStack_c0->super_FunctionProxy);
    }
    bVar2 = FunctionProxy::IsCoroutine(&pPStack_c0->super_FunctionProxy);
    if (bVar2) {
      pJVar10 = ScriptContext::GetLibrary(scriptContext);
      local_e18 = (ScriptContext *)
                  JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                            (pJVar10,&pPStack_c0->super_FunctionProxy);
    }
    else {
      pJVar10 = ScriptContext::GetLibrary(scriptContext);
      local_e18 = (ScriptContext *)
                  JavascriptLibrary::CreateScriptFunction(pJVar10,&pPStack_c0->super_FunctionProxy);
    }
    scriptContext_local = local_e18;
  }
  pfuncCaller._4_4_ = 1;
  CompileScriptException::~CompileScriptException((CompileScriptException *)&funcBody);
  return (ScriptFunction *)scriptContext_local;
}

Assistant:

ScriptFunction* GlobalObject::DefaultEvalHelper(ScriptContext* scriptContext, const char16 *source, int sourceLength, ModuleID moduleID, uint32 grfscr, LPCOLESTR pszTitle, BOOL registerDocument, BOOL isIndirect, BOOL strictMode)
    {
        Assert(sourceLength >= 0);
        AnalysisAssert(scriptContext);
        if (scriptContext->GetThreadContext()->EvalDisabled())
        {
            throw Js::EvalDisabledException();
        }

#ifdef PROFILE_EXEC
        scriptContext->ProfileBegin(Js::EvalCompilePhase);
#endif
        void * frameAddr = nullptr;
        GET_CURRENT_FRAME_ID(frameAddr);

        HRESULT hr = S_OK;
        HRESULT hrParser = S_OK;
        HRESULT hrCodeGen = S_OK;
        CompileScriptException se;
        Js::ParseableFunctionInfo * funcBody = NULL;
        uint sourceIndex = Constants::InvalidSourceIndex;
        BEGIN_LEAVE_SCRIPT_INTERNAL(scriptContext);
        BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT
        {
            uint cchSource = sourceLength;
            size_t cbUtf8Buffer = UInt32Math::MulAdd<3, 1>(cchSource);

            ArenaAllocator tempArena(_u("EvalHelperArena"), scriptContext->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory);
            LPUTF8 utf8Source = AnewArray(&tempArena, utf8char_t, cbUtf8Buffer);

            Assert(cchSource < MAXLONG);
            size_t cbSource = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8Source, cbUtf8Buffer, source, static_cast<charcount_t>(cchSource));
            Assert(cbSource + 1 <= cbUtf8Buffer);

            SRCINFO const * pSrcInfo = scriptContext->GetModuleSrcInfo(moduleID);
            // Source Info objects are kept alive by the function bodies that are referencing it
            // The function body is created in GenerateByteCode but the source info isn't passed in, only the index
            // So we need to pin it here (TODO: Change GenerateByteCode to take in the sourceInfo itself)
            ENTER_PINNED_SCOPE(Utf8SourceInfo, sourceInfo);
            sourceInfo = Utf8SourceInfo::New(scriptContext, utf8Source, cchSource,
              cbSource, pSrcInfo, ((grfscr & fscrIsLibraryCode) != 0));

            Parser parser(scriptContext, strictMode);
            bool forceNoNative = false;

            ParseNodeProg * parseTree = nullptr;

            SourceContextInfo * sourceContextInfo = pSrcInfo->sourceContextInfo;
            ULONG deferParseThreshold = Parser::GetDeferralThreshold(sourceContextInfo->IsSourceProfileLoaded());
            if ((ULONG)sourceLength > deferParseThreshold && !PHASE_OFF1(Phase::DeferParsePhase))
            {
                // Defer function bodies declared inside large dynamic blocks.
                grfscr |= fscrWillDeferFncParse;
            }

            grfscr = grfscr | fscrDynamicCode;

            // fscrEval signifies direct eval in parser
            hrParser = parser.ParseCesu8Source(&parseTree, utf8Source, cbSource, isIndirect ? grfscr & ~fscrEval : grfscr, &se, &sourceContextInfo->nextLocalFunctionId,
                sourceContextInfo);
            sourceInfo->SetParseFlags(grfscr);

            if (SUCCEEDED(hrParser) && parseTree)
            {
                // This keeps function bodies generated by the byte code alive till we return
                Js::AutoDynamicCodeReference dynamicFunctionReference(scriptContext);

                Assert(cchSource < MAXLONG);
                sourceIndex = scriptContext->SaveSourceNoCopy(sourceInfo, cchSource, true);

                // Tell byte code gen not to attempt to interact with the caller's context if this is indirect eval.
                // TODO: Handle strict mode.
                if (isIndirect &&
                    !strictMode &&
                    !parseTree->GetStrictMode())
                {
                    grfscr &= ~fscrEval;
                }
                hrCodeGen = GenerateByteCode(parseTree, grfscr, scriptContext, &funcBody, sourceIndex, forceNoNative, &parser, &se);
                sourceInfo->SetByteCodeGenerationFlags(grfscr);
            }

            LEAVE_PINNED_SCOPE();
        }